

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpatexpress.cc
# Opt level: O1

bool __thiscall
UnconstrainedEquation::resolveOperandLeft(UnconstrainedEquation *this,OperandResolve *state)

{
  pointer ppTVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  state->cur_rightmost = -1;
  iVar2 = -1;
  if (((this->super_PatternEquation).resultpattern.leftellipsis == false) &&
     ((this->super_PatternEquation).resultpattern.rightellipsis == false)) {
    ppTVar1 = (this->super_PatternEquation).resultpattern.toklist.
              super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.super__Vector_impl_data.
              _M_start;
    lVar3 = (long)(this->super_PatternEquation).resultpattern.toklist.
                  super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)ppTVar1;
    if (lVar3 == 0) {
      iVar2 = 0;
    }
    else {
      lVar3 = lVar3 >> 3;
      lVar4 = 0;
      iVar2 = 0;
      do {
        iVar2 = iVar2 + *(int *)(ppTVar1[lVar4] + 0x20);
        lVar4 = lVar4 + 1;
      } while (lVar3 + (ulong)(lVar3 == 0) != lVar4);
    }
  }
  state->size = iVar2;
  return true;
}

Assistant:

bool UnconstrainedEquation::resolveOperandLeft(OperandResolve &state) const

{
  state.cur_rightmost = -1;
  if (resultpattern.getLeftEllipsis()||resultpattern.getRightEllipsis()) // don't know length
    state.size = -1;
  else
    state.size = resultpattern.getMinimumLength();
  return true;
}